

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O0

void __thiscall
optimization::common_expr_del::Node::Node
          (Node *this,Op op,
          vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *operands)

{
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RSI;
  long in_RDI;
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *unaff_retaddr;
  undefined8 in_stack_ffffffffffffffa8;
  int32_t i;
  Value *in_stack_ffffffffffffffb0;
  
  i = (int32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  std::
  vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(unaff_retaddr,in_RSI);
  *(vector<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::variant<int,_optimization::common_expr_del::NodeId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    **)(in_RDI + 0x18) = in_RSI;
  NodeId::NodeId((NodeId *)(in_RDI + 0x20));
  mir::inst::Value::Value(in_stack_ffffffffffffffb0,i);
  std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::list
            ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)0x170774);
  std::__cxx11::list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::list
            ((list<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)0x170787);
  std::optional<mir::inst::Value>::optional((optional<mir::inst::Value> *)0x170795);
  std::
  set<optimization::common_expr_del::NodeId,_std::less<optimization::common_expr_del::NodeId>,_std::allocator<optimization::common_expr_del::NodeId>_>
  ::set((set<optimization::common_expr_del::NodeId,_std::less<optimization::common_expr_del::NodeId>,_std::allocator<optimization::common_expr_del::NodeId>_>
         *)0x1707ab);
  std::
  variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::variant((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)0x1707bc);
  *(undefined1 *)(in_RDI + 0xf8) = 0;
  return;
}

Assistant:

Node(Op op, std::vector<Operand> operands)
      : op(op), operands(operands), is_leaf(false) {
    // if (op.index() == 1 && std::get<ExtraNormOp>(op) == ExtraNormOp::Ref) {
    //   assert(operands.size() == 1);
    // }
  }